

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void rollback_all_test(bool multi_kv)

{
  void *__s1;
  fdb_kvs_handle *__ptr;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  fdb_kvs_handle **ppfVar7;
  long lVar8;
  undefined7 in_register_00000039;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  fdb_file_handle *dbfile;
  int local_574;
  uint64_t num_markers;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *dbhandle;
  fdb_kvs_handle *local_558 [4];
  fdb_kvs_handle **local_538;
  size_t bodylen;
  char kv_name [8];
  fdb_kvs_config kvs_config;
  fdb_kvs_info info;
  timeval __test_begin;
  fdb_doc *local_4c8 [20];
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.block_reusing_threshold = 0;
  fconfig.multi_kv_instances = multi_kv;
  fdb_open(&dbfile,"./mvcc_test6",&fconfig);
  local_574 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_574 == 0) {
    fdb_kvs_open_default(dbfile,local_558,&kvs_config);
    lVar8 = 1;
  }
  else {
    ppfVar7 = local_558;
    lVar8 = 4;
    for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
      sprintf(kv_name,"kv%d",uVar9 & 0xffffffff);
      fdb_kvs_open(dbfile,ppfVar7,kv_name,&kvs_config);
      ppfVar7 = ppfVar7 + 1;
    }
  }
  lVar10 = 0;
  while (lVar8 != lVar10) {
    fVar1 = fdb_set_log_callback(local_558[lVar10],logCallbackFunc,"rollback_all_test");
    lVar10 = lVar10 + 1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x11ce);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x11ce,"void rollback_all_test(bool)");
    }
  }
  local_538 = local_558;
  for (uVar9 = 0; uVar9 != 5; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar9,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      fdb_set(local_558[lVar10],local_4c8[uVar9]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar9 = 5; uVar9 != 10; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar9,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      fdb_set(local_558[lVar10],local_4c8[uVar9]);
    }
  }
  fdb_commit(dbfile,'\0');
  for (uVar9 = 10; uVar9 != 0xf; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar9,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      fdb_set(local_558[lVar10],local_4c8[uVar9]);
    }
  }
  fdb_commit(dbfile,'\x01');
  for (uVar9 = 0xf; uVar9 != 0x14; uVar9 = uVar9 + 1) {
    sprintf(keybuf,"key%d",uVar9 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar9 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar9 & 0xffffffff);
    sVar3 = strlen(keybuf);
    sVar4 = strlen(metabuf);
    sVar5 = strlen(bodybuf);
    fdb_doc_create(local_4c8 + uVar9,keybuf,sVar3,metabuf,sVar4,bodybuf,sVar5);
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      fdb_set(local_558[lVar10],local_4c8[uVar9]);
    }
  }
  fdb_commit(dbfile,'\0');
  fVar1 = fdb_get_all_snap_markers(dbfile,&markers,&num_markers);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x120d);
    rollback_all_test(bool)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x120d,"void rollback_all_test(bool)");
  }
  if ((char)local_574 == '\0') {
    if (num_markers != 4) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1211);
      rollback_all_test(bool)::__test_pass = '\x01';
      if (num_markers != 4) {
        __assert_fail("num_markers == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1211,"void rollback_all_test(bool)");
      }
    }
  }
  else if (num_markers != 8) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x120f);
    rollback_all_test(bool)::__test_pass = '\x01';
    if (num_markers != 8) {
      __assert_fail("num_markers == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x120f,"void rollback_all_test(bool)");
    }
  }
  fVar1 = fdb_rollback_all(dbfile,markers[1].marker);
  if ((char)local_574 == '\0') {
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001170e3;
  }
  else {
    if (fVar1 != FDB_RESULT_KV_STORE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x121c);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_KV_STORE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x121c,"void rollback_all_test(bool)");
    }
    for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
      fdb_kvs_close(local_558[lVar10]);
    }
    fVar1 = fdb_open((fdb_file_handle **)&info,"./mvcc_test6",&fconfig);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1225);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1225,"void rollback_all_test(bool)");
    }
    fVar1 = fdb_kvs_open((fdb_file_handle *)info.name,&dbhandle,"kv0",&kvs_config);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1227);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1227,"void rollback_all_test(bool)");
    }
    fVar1 = fdb_rollback_all(dbfile,markers[1].marker);
    if (fVar1 != FDB_RESULT_KV_STORE_BUSY) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x122a);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_KV_STORE_BUSY",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x122a,"void rollback_all_test(bool)");
    }
    fVar1 = fdb_kvs_close(dbhandle);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x122d);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x122d,"void rollback_all_test(bool)");
    }
    fVar1 = fdb_close((fdb_file_handle *)info.name);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x122f);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x122f,"void rollback_all_test(bool)");
    }
    fVar1 = fdb_rollback_all(dbfile,markers[1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_001170e3:
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1234);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1234,"void rollback_all_test(bool)");
    }
    uVar9 = 0;
    lVar10 = lVar8;
    while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
      sprintf(kv_name,"kv%d",uVar9);
      ppfVar7 = local_538;
      fVar1 = fdb_kvs_open(dbfile,local_538,kv_name,&kvs_config);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x123a);
        rollback_all_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x123a,"void rollback_all_test(bool)");
      }
      fVar1 = fdb_set_log_callback(*ppfVar7,logCallbackFunc,"rollback_all_test");
      local_538 = ppfVar7 + 1;
      uVar9 = (ulong)((int)uVar9 + 1);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x123d);
        rollback_all_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x123d,"void rollback_all_test(bool)");
      }
    }
  }
  lVar10 = 0;
  while( true ) {
    if (lVar8 == lVar10) {
      lVar10 = 0;
      while (lVar8 != lVar10) {
        fVar1 = fdb_set(local_558[lVar10],local_4c8[0]);
        lVar10 = lVar10 + 1;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1254);
          rollback_all_test(bool)::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1254,"void rollback_all_test(bool)");
        }
      }
      fVar1 = fdb_commit(dbfile,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1257);
        rollback_all_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1257,"void rollback_all_test(bool)");
      }
      fdb_close(dbfile);
      for (lVar8 = 0; lVar8 != 0x14; lVar8 = lVar8 + 1) {
        fdb_doc_free(local_4c8[lVar8]);
      }
      fVar1 = fdb_free_snap_markers(markers,num_markers);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar6 = "single kv mode:";
        if ((char)local_574 != '\0') {
          pcVar6 = "multiple kv mode:";
        }
        sprintf(bodybuf,"rollback all test %s",pcVar6);
        pcVar6 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar6,bodybuf);
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1262);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1262,"void rollback_all_test(bool)");
    }
    fVar1 = fdb_get_kvs_info(local_558[lVar10],&info);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1245);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1245,"void rollback_all_test(bool)");
    }
    if (info.last_seqnum != 0xf) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1246);
      rollback_all_test(bool)::__test_pass = '\x01';
      if (info.last_seqnum != 0xf) {
        __assert_fail("info.last_seqnum == rollback_seq",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1246,"void rollback_all_test(bool)");
      }
    }
    if (info.doc_count != 0xf) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1247);
      rollback_all_test(bool)::__test_pass = '\x01';
      if (info.doc_count != 0xf) {
        __assert_fail("info.doc_count == rollback_seq",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1247,"void rollback_all_test(bool)");
      }
    }
    fVar1 = fdb_get(local_558[lVar10],local_4c8[0x13]);
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) break;
    fVar1 = fdb_get_kv(local_558[lVar10],local_4c8[0]->key,local_4c8[0]->keylen,&dbhandle,&bodylen);
    __ptr = dbhandle;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x124c);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x124c,"void rollback_all_test(bool)");
    }
    __s1 = local_4c8[0]->body;
    iVar2 = bcmp(__s1,dbhandle,bodylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",__ptr,__s1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x124d);
      rollback_all_test(bool)::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x124d,"void rollback_all_test(bool)");
    }
    free(__ptr);
    lVar10 = lVar10 + 1;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x1249);
  rollback_all_test(bool)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1249,"void rollback_all_test(bool)");
}

Assistant:

void rollback_all_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info info;
    fdb_snapshot_info_t *markers;
    fdb_seqnum_t rollback_seq;
    uint64_t num_markers;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    // remove previous dummy files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test6", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_all_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    if (multi_kv) {
        TEST_CHK(num_markers == 8);
    } else {
        TEST_CHK(num_markers == 4);
    }

    // rollback to 15
    i = 1;
    rollback_seq = (fdb_seqnum_t)(n - (i*5));
    status = fdb_rollback_all(dbfile, markers[i].marker);
    if (multi_kv) {
        // In multi-kv mode, we cannot rollback all instances,
        // without closing them first, since a rollback point
        // may end up invalidating open handles
        TEST_CHK(status == FDB_RESULT_KV_STORE_BUSY);

        for (r = 0; r < num_kvs; ++r) {
            fdb_kvs_close(db[r]);
        }

        fdb_file_handle *fhandle;
        fdb_kvs_handle *dbhandle;
        status = fdb_open(&fhandle, "./mvcc_test6", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(fhandle, &dbhandle, "kv0", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Rollback again, but should fail again because there is a new handle created
        status = fdb_rollback_all(dbfile, markers[i].marker);
        TEST_CHK(status == FDB_RESULT_KV_STORE_BUSY);
        // Close the handle to have the rollback pass
        status = fdb_kvs_close(dbhandle);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_close(fhandle);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_rollback_all(dbfile, markers[i].marker);
    }

    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                    (void *) "rollback_all_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (r = 0; r < num_kvs; ++r) {
        char *body;
        size_t bodylen;
        status = fdb_get_kvs_info(db[r], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == rollback_seq);
        TEST_CHK(info.doc_count == rollback_seq);
        status = fdb_get(db[r], doc[n - 1]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        status = fdb_get_kv(db[r], doc[0]->key, doc[0]->keylen,
                            (void **)&body, &bodylen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(doc[0]->body, body, bodylen);
        free(body);
    }

    // test normal operation after rollbacks manually flush WAL & commit
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback all test %s", multi_kv ? "multiple kv mode:"
                                                      : "single kv mode:");
    TEST_RESULT(bodybuf);
}